

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cd_hull.cpp
# Opt level: O2

HullError __thiscall
ConvexDecomposition::HullLibrary::CreateConvexHull
          (HullLibrary *this,HullDesc *desc,HullResult *result)

{
  undefined8 uVar1;
  uint uVar2;
  bool bVar3;
  ulong uVar4;
  float *vertices;
  uint *puVar5;
  uint *puVar6;
  long lVar7;
  ulong uVar8;
  uint uVar9;
  HullError HVar10;
  float *__ptr;
  HullLibrary *pHVar11;
  uint *source;
  uint *__src;
  uint uVar12;
  undefined1 auVar13 [16];
  uint ovcount;
  float *local_80;
  float *local_78;
  size_t local_70;
  HullResult *local_68;
  PHullResult hr;
  float scale [3];
  
  hr.mVcount = 0;
  hr.mIndexCount = 0;
  hr.mFaceCount = 0;
  hr.mVertices = (float *)0x0;
  hr.mIndices = (uint *)0x0;
  uVar2 = desc->mVcount;
  uVar4 = 8;
  if (8 < uVar2) {
    uVar4 = (ulong)uVar2;
  }
  pHVar11 = (HullLibrary *)(uVar4 * 0xc);
  vertices = (float *)malloc((size_t)pHVar11);
  bVar3 = CleanupVertices(pHVar11,uVar2,desc->mVertices,desc->mVertexStride,&ovcount,vertices,
                          desc->mNormalEpsilon,scale);
  HVar10 = QE_FAIL;
  if (bVar3) {
    uVar4 = 0;
    while ((ulong)ovcount * 3 != uVar4) {
      uVar8 = uVar4 & 0xffffffff;
      uVar4 = uVar4 + 3;
      auVar13._0_4_ = (float)scale._0_8_ * (float)*(undefined8 *)(vertices + uVar8);
      auVar13._4_4_ =
           SUB84(scale._0_8_,4) * (float)((ulong)*(undefined8 *)(vertices + uVar8) >> 0x20);
      auVar13._8_8_ = 0;
      uVar1 = vmovlps_avx(auVar13);
      *(undefined8 *)(vertices + uVar8) = uVar1;
      vertices[uVar8 + 2] = scale[2] * vertices[uVar8 + 2];
    }
    bVar3 = ComputeHull(ovcount,vertices,&hr,desc->mMaxVertices,
                        (float)((uint)((desc->mFlags & 4) != 0) * (int)desc->mSkinWidth));
    if (bVar3) {
      uVar2 = hr.mVcount;
      pHVar11 = (HullLibrary *)((hr._0_8_ & 0xffffffff) * 0xc);
      local_80 = (float *)malloc((size_t)pHVar11);
      __src = hr.mIndices;
      uVar9 = hr.mIndexCount;
      uVar4 = (ulong)hr.mIndexCount;
      BringOutYourDead(pHVar11,hr.mVertices,uVar2,local_80,&ovcount,hr.mIndices,hr.mIndexCount);
      uVar2 = desc->mFlags;
      local_68 = result;
      if ((uVar2 & 1) == 0) {
        result->mPolygons = true;
        local_70 = (ulong)ovcount * 0xc;
        result->mNumOutputVertices = ovcount;
        local_78 = (float *)malloc(local_70);
        uVar12 = hr.mFaceCount;
        result->mOutputVertices = local_78;
        uVar9 = uVar9 + hr.mFaceCount;
        result->mNumFaces = hr.mFaceCount;
        result->mNumIndices = uVar9;
        puVar5 = (uint *)malloc((ulong)uVar9 << 2);
        __ptr = local_80;
        local_68->mIndices = puVar5;
        memcpy(local_78,local_80,local_70);
        puVar5 = puVar5 + 2;
        while (bVar3 = uVar12 != 0, uVar12 = uVar12 - 1, bVar3) {
          puVar5[-2] = 3;
          if ((uVar2 & 2) == 0) {
            puVar5[-1] = *__src;
            *puVar5 = __src[1];
            puVar6 = __src + 2;
          }
          else {
            puVar5[-1] = __src[2];
            *puVar5 = __src[1];
            puVar6 = __src;
          }
          __src = __src + 3;
          puVar5[1] = *puVar6;
          puVar5 = puVar5 + 4;
        }
      }
      else {
        result->mPolygons = false;
        local_70 = (ulong)ovcount * 0xc;
        result->mNumOutputVertices = ovcount;
        local_78 = (float *)malloc(local_70);
        uVar12 = hr.mFaceCount;
        result->mOutputVertices = local_78;
        result->mNumFaces = hr.mFaceCount;
        result->mNumIndices = uVar9;
        puVar5 = (uint *)malloc(uVar4 * 4);
        local_68->mIndices = puVar5;
        memcpy(local_78,local_80,local_70);
        if ((uVar2 & 2) == 0) {
          memcpy(puVar5,__src,uVar4 * 4);
          __ptr = local_80;
        }
        else {
          lVar7 = 0;
          while (bVar3 = uVar12 != 0, uVar12 = uVar12 - 1, __ptr = local_80, bVar3) {
            *(undefined4 *)((long)puVar5 + lVar7) = *(undefined4 *)((long)__src + lVar7 + 8);
            *(undefined4 *)((long)puVar5 + lVar7 + 4) = *(undefined4 *)((long)__src + lVar7 + 4);
            *(undefined4 *)((long)puVar5 + lVar7 + 8) = *(undefined4 *)((long)__src + lVar7);
            lVar7 = lVar7 + 0xc;
          }
        }
      }
      ReleaseHull(&hr);
      free(__ptr);
      HVar10 = QE_OK;
    }
  }
  free(vertices);
  return HVar10;
}

Assistant:

HullError HullLibrary::CreateConvexHull(const HullDesc       &desc,           // describes the input request
																					HullResult           &result)         // contains the resulst
{
	HullError ret = QE_FAIL;


	PHullResult hr;

	unsigned int vcount = desc.mVcount;
	if ( vcount < 8 ) vcount = 8;

	float *vsource  = (float *) malloc( sizeof(float)*vcount*3);


	float scale[3];

	unsigned int ovcount;

	bool ok = CleanupVertices(desc.mVcount,desc.mVertices, desc.mVertexStride, ovcount, vsource, desc.mNormalEpsilon, scale ); // normalize point cloud, remove duplicates!

	if ( ok )
	{


		if ( 1 ) // scale vertices back to their original size.
		{
			for (unsigned int i=0; i<ovcount; i++)
			{
				float *v = &vsource[i*3];
				v[0]*=scale[0];
				v[1]*=scale[1];
				v[2]*=scale[2];
			}
		}

		float skinwidth = 0;
		if ( desc.HasHullFlag(QF_SKIN_WIDTH) )
			skinwidth = desc.mSkinWidth;

		ok = ComputeHull(ovcount,vsource,hr,desc.mMaxVertices,skinwidth);

		if ( ok )
		{

			// re-index triangle mesh so it refers to only used vertices, rebuild a new vertex table.
			float *vscratch = (float *) malloc( sizeof(float)*hr.mVcount*3);
			BringOutYourDead(hr.mVertices,hr.mVcount, vscratch, ovcount, hr.mIndices, hr.mIndexCount );

			ret = QE_OK;

			if ( desc.HasHullFlag(QF_TRIANGLES) ) // if he wants the results as triangle!
			{
				result.mPolygons          = false;
				result.mNumOutputVertices = ovcount;
				result.mOutputVertices    = (float *)malloc( sizeof(float)*ovcount*3);
				result.mNumFaces          = hr.mFaceCount;
				result.mNumIndices        = hr.mIndexCount;

				result.mIndices           = (unsigned int *) malloc( sizeof(unsigned int)*hr.mIndexCount);

				memcpy(result.mOutputVertices, vscratch, sizeof(float)*3*ovcount );

  			if ( desc.HasHullFlag(QF_REVERSE_ORDER) )
				{

					const unsigned int *source = hr.mIndices;
								unsigned int *dest   = result.mIndices;

					for (unsigned int i=0; i<hr.mFaceCount; i++)
					{
						dest[0] = source[2];
						dest[1] = source[1];
						dest[2] = source[0];
						dest+=3;
						source+=3;
					}

				}
				else
				{
					memcpy(result.mIndices, hr.mIndices, sizeof(unsigned int)*hr.mIndexCount);
				}
			}
			else
			{
				result.mPolygons          = true;
				result.mNumOutputVertices = ovcount;
				result.mOutputVertices    = (float *)malloc( sizeof(float)*ovcount*3);
				result.mNumFaces          = hr.mFaceCount;
				result.mNumIndices        = hr.mIndexCount+hr.mFaceCount;
				result.mIndices           = (unsigned int *) malloc( sizeof(unsigned int)*result.mNumIndices);
				memcpy(result.mOutputVertices, vscratch, sizeof(float)*3*ovcount );

				if ( 1 )
				{
					const unsigned int *source = hr.mIndices;
								unsigned int *dest   = result.mIndices;
					for (unsigned int i=0; i<hr.mFaceCount; i++)
					{
						dest[0] = 3;
						if ( desc.HasHullFlag(QF_REVERSE_ORDER) )
						{
							dest[1] = source[2];
							dest[2] = source[1];
							dest[3] = source[0];
						}
						else
						{
							dest[1] = source[0];
							dest[2] = source[1];
							dest[3] = source[2];
						}

						dest+=4;
						source+=3;
					}
				}
			}
			ReleaseHull(hr);
			if ( vscratch )
			{
				free(vscratch);
			}
		}
	}

	if ( vsource )
	{
		free(vsource);
	}


	return ret;
}